

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O2

UDate __thiscall
icu_63::CalendarAstronomer::timeOfAngle
          (CalendarAstronomer *this,AngleFunc *func,double desired,double periodDays,double epsilon,
          UBool next)

{
  double dVar1;
  double extraout_XMM0_Qa;
  double dVar2;
  double dVar3;
  double extraout_XMM0_Qa_00;
  double dVar4;
  double dVar5;
  double local_68;
  double local_60;
  
  if (next == '\0') {
    dVar1 = -6.283185307179586;
  }
  else {
    dVar1 = 0.0;
  }
  do {
    (**func->_vptr_AngleFunc)(func,this);
    dVar2 = norm2PI(desired - extraout_XMM0_Qa);
    local_68 = ((dVar2 + dVar1) * periodDays * 86400000.0) / 6.283185307179586;
    dVar2 = this->fTime;
    dVar3 = uprv_ceil_63(local_68);
    this->fTime = dVar3 + dVar2;
    clearCache(this);
    local_60 = extraout_XMM0_Qa;
    while( true ) {
      (**func->_vptr_AngleFunc)(func,this);
      dVar3 = normPI(extraout_XMM0_Qa_00 - local_60);
      dVar3 = uprv_fabs_63(local_68 / dVar3);
      dVar4 = normPI(desired - extraout_XMM0_Qa_00);
      dVar4 = dVar4 * dVar3;
      dVar3 = uprv_fabs_63(dVar4);
      dVar5 = uprv_fabs_63(local_68);
      if (dVar5 < dVar3) break;
      dVar3 = this->fTime;
      dVar5 = uprv_ceil_63(dVar4);
      this->fTime = dVar5 + dVar3;
      clearCache(this);
      dVar3 = uprv_fabs_63(dVar4);
      local_68 = dVar4;
      local_60 = extraout_XMM0_Qa_00;
      if (dVar3 <= epsilon) {
        return this->fTime;
      }
    }
    dVar3 = uprv_ceil_63(periodDays * 86400000.0 * 0.125);
    if (next == '\0') {
      dVar3 = -dVar3;
    }
    this->fTime = dVar2 + dVar3;
    clearCache(this);
  } while( true );
}

Assistant:

UDate CalendarAstronomer::timeOfAngle(AngleFunc& func, double desired,
                                      double periodDays, double epsilon, UBool next)
{
    // Find the value of the function at the current time
    double lastAngle = func.eval(*this);

    // Find out how far we are from the desired angle
    double deltaAngle = norm2PI(desired - lastAngle) ;

    // Using the average period, estimate the next (or previous) time at
    // which the desired angle occurs.
    double deltaT =  (deltaAngle + (next ? 0.0 : - CalendarAstronomer_PI2 )) * (periodDays*DAY_MS) / CalendarAstronomer_PI2;

    double lastDeltaT = deltaT; // Liu
    UDate startTime = fTime; // Liu

    setTime(fTime + uprv_ceil(deltaT));

    // Now iterate until we get the error below epsilon.  Throughout
    // this loop we use normPI to get values in the range -Pi to Pi,
    // since we're using them as correction factors rather than absolute angles.
    do {
        // Evaluate the function at the time we've estimated
        double angle = func.eval(*this);

        // Find the # of milliseconds per radian at this point on the curve
        double factor = uprv_fabs(deltaT / normPI(angle-lastAngle));

        // Correct the time estimate based on how far off the angle is
        deltaT = normPI(desired - angle) * factor;

        // HACK:
        //
        // If abs(deltaT) begins to diverge we need to quit this loop.
        // This only appears to happen when attempting to locate, for
        // example, a new moon on the day of the new moon.  E.g.:
        //
        // This result is correct:
        // newMoon(7508(Mon Jul 23 00:00:00 CST 1990,false))=
        //   Sun Jul 22 10:57:41 CST 1990
        //
        // But attempting to make the same call a day earlier causes deltaT
        // to diverge:
        // CalendarAstronomer.timeOfAngle() diverging: 1.348508727575625E9 ->
        //   1.3649828540224032E9
        // newMoon(7507(Sun Jul 22 00:00:00 CST 1990,false))=
        //   Sun Jul 08 13:56:15 CST 1990
        //
        // As a temporary solution, we catch this specific condition and
        // adjust our start time by one eighth period days (either forward
        // or backward) and try again.
        // Liu 11/9/00
        if (uprv_fabs(deltaT) > uprv_fabs(lastDeltaT)) {
            double delta = uprv_ceil (periodDays * DAY_MS / 8.0);
            setTime(startTime + (next ? delta : -delta));
            return timeOfAngle(func, desired, periodDays, epsilon, next);
        }

        lastDeltaT = deltaT;
        lastAngle = angle;

        setTime(fTime + uprv_ceil(deltaT));
    }
    while (uprv_fabs(deltaT) > epsilon);

    return fTime;
}